

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exponential_dist.hpp
# Opt level: O2

result_type_conflict3 * __thiscall
trng::exponential_dist<long_double>::pdf
          (result_type_conflict3 *__return_storage_ptr__,exponential_dist<long_double> *this,
          result_type_conflict3 x)

{
  result_type_conflict3 *in_RAX;
  
  if ((longdouble)0 <= x._0_10_) {
    in_RAX = (result_type_conflict3 *)expl();
  }
  return in_RAX;
}

Assistant:

pdf(result_type x) const { return x < 0 ? 0 : math::exp(-x / P.mu()) / P.mu(); }